

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pragmaVtabBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  byte bVar1;
  int iVar2;
  sqlite3_index_constraint_usage *psVar3;
  uchar *puVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  int seen [2];
  
  pIdxInfo->estimatedCost = 1.0;
  if (*(char *)&tab[1].zErrMsg != '\0') {
    seen[0] = 0;
    seen[1] = 0;
    iVar2 = pIdxInfo->nConstraint;
    if (0 < iVar2) {
      puVar4 = &pIdxInfo->aConstraint->usable;
      iVar6 = 1;
      do {
        if ((*puVar4 != '\0') && (puVar4[-1] == '\x02')) {
          bVar1 = *(byte *)((long)&tab[1].zErrMsg + 1);
          if ((int)(uint)bVar1 <= ((sqlite3_index_constraint *)(puVar4 + -5))->iColumn) {
            seen[(long)((sqlite3_index_constraint *)(puVar4 + -5))->iColumn - (ulong)bVar1] = iVar6;
          }
        }
        puVar4 = puVar4 + 0xc;
        bVar7 = iVar6 != iVar2;
        iVar6 = iVar6 + 1;
      } while (bVar7);
      lVar5 = (long)seen[0];
      if (lVar5 != 0) {
        psVar3 = pIdxInfo->aConstraintUsage;
        psVar3[lVar5 + -1].argvIndex = 1;
        psVar3[lVar5 + -1].omit = '\x01';
        lVar5 = (long)seen[1];
        if (lVar5 == 0) {
          return 0;
        }
        pIdxInfo->estimatedCost = 20.0;
        pIdxInfo->estimatedRows = 0x14;
        psVar3[lVar5 + -1].argvIndex = 2;
        psVar3[lVar5 + -1].omit = '\x01';
        return 0;
      }
    }
    pIdxInfo->estimatedCost = 2147483647.0;
    pIdxInfo->estimatedRows = 0x7fffffff;
  }
  return 0;
}

Assistant:

static int pragmaVtabBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  PragmaVtab *pTab = (PragmaVtab*)tab;
  const struct sqlite3_index_constraint *pConstraint;
  int i, j;
  int seen[2];

  pIdxInfo->estimatedCost = (double)1;
  if( pTab->nHidden==0 ){ return SQLITE_OK; }
  pConstraint = pIdxInfo->aConstraint;
  seen[0] = 0;
  seen[1] = 0;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    if( pConstraint->usable==0 ) continue;
    if( pConstraint->op!=SQLITE_INDEX_CONSTRAINT_EQ ) continue;
    if( pConstraint->iColumn < pTab->iHidden ) continue;
    j = pConstraint->iColumn - pTab->iHidden;
    assert( j < 2 );
    seen[j] = i+1;
  }
  if( seen[0]==0 ){
    pIdxInfo->estimatedCost = (double)2147483647;
    pIdxInfo->estimatedRows = 2147483647;
    return SQLITE_OK;
  }
  j = seen[0]-1;
  pIdxInfo->aConstraintUsage[j].argvIndex = 1;
  pIdxInfo->aConstraintUsage[j].omit = 1;
  if( seen[1]==0 ) return SQLITE_OK;
  pIdxInfo->estimatedCost = (double)20;
  pIdxInfo->estimatedRows = 20;
  j = seen[1]-1;
  pIdxInfo->aConstraintUsage[j].argvIndex = 2;
  pIdxInfo->aConstraintUsage[j].omit = 1;
  return SQLITE_OK;
}